

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem*>::push_back<Hpipe::CharItem*&>
          (Vec<Hpipe::CharItem*> *this,CharItem **args)

{
  iterator __position;
  
  __position._M_current = *(CharItem ***)(this + 8);
  if (__position._M_current == *(CharItem ***)(this + 0x10)) {
    std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::
    _M_realloc_insert<Hpipe::CharItem*&>
              ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)this,__position,args);
  }
  else {
    *__position._M_current = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  return (CharItem **)(*(long *)(this + 8) + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }